

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.cc
# Opt level: O0

void __thiscall
Zip::SignatureError::SignatureError(SignatureError *this,uint32_t expected,uint32_t actual)

{
  ostream *poVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  exception *in_RDI;
  stringstream ss;
  string local_1d0 [36];
  int local_1ac;
  int local_1a8;
  long local_198 [2];
  ostream local_188 [376];
  undefined4 local_10;
  undefined4 local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__SignatureError_0010bd58;
  *(undefined4 *)(in_RDI + 8) = local_c;
  *(undefined4 *)(in_RDI + 0xc) = local_10;
  std::__cxx11::string::string((string *)(in_RDI + 0x10));
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  std::ios::fill((char)local_198 + (char)*(undefined8 *)(local_198[0] + -0x18));
  poVar1 = std::operator<<(local_188,"Expected signature 0x");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  local_1a8 = (int)std::setw(8);
  poVar1 = std::operator<<(poVar1,(_Setw)local_1a8);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RDI + 8));
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,"got signature 0x");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  local_1ac = (int)std::setw(8);
  poVar1 = std::operator<<(poVar1,(_Setw)local_1ac);
  std::ostream::operator<<(poVar1,*(uint *)(in_RDI + 0xc));
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)(in_RDI + 0x10),local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  return;
}

Assistant:

Zip::SignatureError::SignatureError(uint32_t expected, uint32_t actual)
  : expected_(expected), actual_(actual) {
  std::stringstream ss;
  ss.fill('0');
  ss << "Expected signature 0x"
     << std::hex << std::setw(8) << expected_ << ", "
     << "got signature 0x"
     << std::hex << std::setw(8) << actual_;
  error_ = ss.str();
}